

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::makeWaveletGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,int order,
          vector<int,_std::allocator<int>_> *level_limits)

{
  bool bVar1;
  invalid_argument *piVar2;
  size_type sVar3;
  pointer local_a8;
  unique_ptr<TasGrid::GridWavelet,_std::default_delete<TasGrid::GridWavelet>_> local_a0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string message;
  vector<int,_std::allocator<int>_> *level_limits_local;
  int order_local;
  int depth_local;
  int outputs_local;
  int dimensions_local;
  TasmanianSparseGrid *this_local;
  
  level_limits_local._0_4_ = order;
  level_limits_local._4_4_ = depth;
  order_local = outputs;
  depth_local = dimensions;
  _outputs_local = this;
  if (dimensions < 1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeWaveletGrid() requires positive dimensions");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if (outputs < 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeWaveletGrid() requires non-negative outputs");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if (depth < 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeWaveletGrid() requires non-negative depth");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if ((order != 1) && (order != 3)) {
    ::std::__cxx11::to_string(&local_98,order);
    ::std::operator+(&local_78,"ERROR: makeWaveletGrid() is called with order: ",&local_98);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_78,", but wavelets are implemented only for orders 1 and 3.");
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_98);
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument(piVar2,(string *)local_58);
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(level_limits);
  if (!bVar1) {
    sVar3 = ::std::vector<int,_std::allocator<int>_>::size(level_limits);
    if (sVar3 != (long)depth_local) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (piVar2,
                 "ERROR: makeWaveletGrid() requires level_limits with either 0 or dimensions entries"
                );
      __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
  }
  clear(this);
  ::std::vector<int,_std::allocator<int>_>::operator=(&this->llimits,level_limits);
  local_a8 = ::std::
             unique_ptr<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
             ::get(&this->acceleration);
  Utils::
  make_unique<TasGrid::GridWavelet,TasGrid::AccelerationContext*,int&,int&,int&,int&,std::vector<int,std::allocator<int>>&>
            ((Utils *)&local_a0,&local_a8,&depth_local,&order_local,
             (int *)((long)&level_limits_local + 4),(int *)&level_limits_local,&this->llimits);
  ::std::unique_ptr<TasGrid::BaseCanonicalGrid,std::default_delete<TasGrid::BaseCanonicalGrid>>::
  operator=((unique_ptr<TasGrid::BaseCanonicalGrid,std::default_delete<TasGrid::BaseCanonicalGrid>>
             *)&this->base,&local_a0);
  ::std::unique_ptr<TasGrid::GridWavelet,_std::default_delete<TasGrid::GridWavelet>_>::~unique_ptr
            (&local_a0);
  return;
}

Assistant:

void TasmanianSparseGrid::makeWaveletGrid(int dimensions, int outputs, int depth, int order, const std::vector<int> &level_limits){
    if (dimensions < 1) throw std::invalid_argument("ERROR: makeWaveletGrid() requires positive dimensions");
    if (outputs < 0) throw std::invalid_argument("ERROR: makeWaveletGrid() requires non-negative outputs");
    if (depth < 0) throw std::invalid_argument("ERROR: makeWaveletGrid() requires non-negative depth");
    if ((order != 1) && (order != 3)){
        std::string message = "ERROR: makeWaveletGrid() is called with order: " + std::to_string(order) + ", but wavelets are implemented only for orders 1 and 3.";
        throw std::invalid_argument(message);
    }
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dimensions)) throw std::invalid_argument("ERROR: makeWaveletGrid() requires level_limits with either 0 or dimensions entries");
    clear();
    llimits = level_limits;
    base = Utils::make_unique<GridWavelet>(acceleration.get(), dimensions, outputs, depth, order, llimits);
}